

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

lys_node *
lys_node_dup_recursion
          (lys_module *module,lys_node *parent,lys_node *node,unres_schema *unres,int shallow,
          int finalize)

{
  uint8_t uVar1;
  byte bVar2;
  ushort uVar3;
  LYS_NODE LVar4;
  int iVar5;
  int iVar6;
  lys_iffeature *plVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  int iVar13;
  int iVar14;
  lys_node *plVar15;
  lys_node *plVar16;
  char *pcVar17;
  lys_iffeature *plVar18;
  uint8_t *__dest;
  lys_feature **pplVar19;
  LY_ERR *pLVar20;
  lys_when *plVar21;
  lys_restr *plVar22;
  lys_node *plVar23;
  void *pvVar24;
  lys_module *plVar25;
  lys_node *plVar26;
  lys_ext_instance **pplVar27;
  lys_ext_instance *plVar28;
  lys_ext *plVar29;
  undefined8 *new_item;
  ushort uVar30;
  undefined8 uVar31;
  lys_node *plVar32;
  lys_node *plVar33;
  lys_node *plVar34;
  ulong uVar35;
  size_t __size;
  lys_node *new_item_00;
  lys_node *plVar36;
  ulong uVar37;
  ly_ctx *plVar38;
  long lVar39;
  uint local_a0;
  int local_9c;
  uint size1;
  lys_node *local_90;
  lys_node *local_88;
  uint local_7c;
  int iStack_78;
  uint size2;
  lys_node *local_70;
  lys_node *local_68;
  lys_node *local_60;
  lys_node_list *list_orig;
  lys_node *local_50;
  ly_ctx *local_48;
  lys_module *local_40;
  lys_node *local_38;
  
  _iStack_78 = CONCAT44(size2,shallow);
  plVar38 = module->ctx;
  LVar4 = node->nodetype;
  local_9c = finalize;
  _size1 = parent;
  local_60 = node;
  if ((int)LVar4 < 0x80) {
    if ((int)LVar4 < 0x10) {
      switch(LVar4) {
      case LYS_CONTAINER:
        plVar15 = (lys_node *)calloc(1,0x88);
        local_88 = (lys_node *)0x0;
        local_50 = (lys_node *)0x0;
        local_70 = (lys_node *)0x0;
        local_68 = (lys_node *)0x0;
        plVar16 = (lys_node *)0x0;
        local_90 = (lys_node *)0x0;
        plVar23 = plVar15;
        break;
      case LYS_CHOICE:
        plVar15 = (lys_node *)calloc(1,0x78);
        local_50 = (lys_node *)0x0;
        local_70 = (lys_node *)0x0;
        local_68 = (lys_node *)0x0;
        plVar16 = (lys_node *)0x0;
        local_90 = (lys_node *)0x0;
        plVar23 = (lys_node *)0x0;
        local_88 = plVar15;
        break;
      default:
        goto switchD_00159077_caseD_3;
      case LYS_LEAF:
        local_50 = (lys_node *)calloc(1,200);
        local_70 = (lys_node *)0x0;
        local_68 = (lys_node *)0x0;
        plVar16 = (lys_node *)0x0;
        local_90 = (lys_node *)0x0;
        plVar15 = local_50;
        plVar23 = (lys_node *)0x0;
        local_88 = (lys_node *)0x0;
        break;
      case LYS_LEAFLIST:
        local_70 = (lys_node *)calloc(1,0xd0);
        local_50 = (lys_node *)0x0;
        local_68 = (lys_node *)0x0;
        plVar16 = (lys_node *)0x0;
        local_90 = (lys_node *)0x0;
        plVar15 = local_70;
        plVar23 = (lys_node *)0x0;
        local_88 = (lys_node *)0x0;
      }
LAB_001591b2:
      plVar36 = (lys_node *)0x0;
    }
    else {
      if (LVar4 == LYS_LIST) {
        local_68 = (lys_node *)calloc(1,0xa0);
        local_50 = (lys_node *)0x0;
        local_70 = (lys_node *)0x0;
        plVar16 = (lys_node *)0x0;
        local_90 = (lys_node *)0x0;
        plVar15 = local_68;
        plVar23 = (lys_node *)0x0;
        local_88 = (lys_node *)0x0;
        goto LAB_001591b2;
      }
      if (LVar4 == LYS_ANYXML) {
LAB_0015916c:
        plVar16 = (lys_node *)calloc(1,0x78);
        local_50 = (lys_node *)0x0;
        local_70 = (lys_node *)0x0;
        local_68 = (lys_node *)0x0;
        local_90 = (lys_node *)0x0;
        plVar15 = plVar16;
        plVar23 = (lys_node *)0x0;
        local_88 = (lys_node *)0x0;
        goto LAB_001591b2;
      }
      if (LVar4 != LYS_CASE) goto switchD_00159077_caseD_3;
      plVar15 = (lys_node *)calloc(1,0x70);
      plVar23 = (lys_node *)0x0;
      local_88 = (lys_node *)0x0;
      local_50 = (lys_node *)0x0;
      local_70 = (lys_node *)0x0;
      local_68 = (lys_node *)0x0;
      plVar16 = (lys_node *)0x0;
      local_90 = (lys_node *)0x0;
      plVar36 = plVar15;
    }
    if (plVar15 == (lys_node *)0x0) {
      pLVar20 = ly_errno_location();
      *pLVar20 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_node_dup_recursion");
      return (lys_node *)0x0;
    }
    pcVar17 = lydict_insert(plVar38,node->name,0);
    plVar15->name = pcVar17;
    pcVar17 = lydict_insert(plVar38,node->dsc,0);
    plVar15->dsc = pcVar17;
    pcVar17 = lydict_insert(plVar38,node->ref,0);
    plVar15->ref = pcVar17;
    plVar15->flags = node->flags;
    plVar15->module = module;
    plVar15->nodetype = node->nodetype;
    plVar15->prev = plVar15;
    uVar1 = node->ext_size;
    plVar15->ext_size = uVar1;
    iVar13 = lys_ext_dup(module,node->ext,uVar1,plVar15,LYEXT_PAR_NODE,&plVar15->ext,unres);
    plVar34 = plVar15;
    if (iVar13 != 0) goto LAB_00159260;
    bVar2 = node->iffeature_size;
    if ((ulong)bVar2 != 0) {
      plVar15->iffeature_size = bVar2;
      plVar18 = (lys_iffeature *)calloc((ulong)bVar2,0x20);
      plVar15->iffeature = plVar18;
      if (plVar18 != (lys_iffeature *)0x0) goto LAB_001592ce;
LAB_00159eaf:
      pLVar20 = ly_errno_location();
      *pLVar20 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_node_dup_recursion");
      plVar34 = plVar15;
      goto LAB_00159260;
    }
LAB_001592ce:
    list_orig = (lys_node_list *)unres;
    local_40 = module;
    local_38 = plVar15;
    if (iStack_78 == 0) {
      plVar32 = _size1;
      plVar33 = _size1;
      local_48 = plVar38;
      if (node->iffeature_size != '\0') {
        uVar35 = 0;
        do {
          resolve_iffeature_getsizes(node->iffeature + uVar35,&local_a0,&local_7c);
          if (local_a0 != 0) {
            uVar37 = (ulong)((local_a0 & 3) != 0 || local_a0 >> 2 != 0);
            __dest = (uint8_t *)malloc(uVar37);
            plVar18 = local_38->iffeature;
            plVar18[uVar35].expr = __dest;
            memcpy(__dest,node->iffeature[uVar35].expr,uVar37);
            uVar37 = (ulong)local_7c;
            pplVar19 = (lys_feature **)calloc(uVar37,8);
            plVar18[uVar35].features = pplVar19;
            if (uVar37 != 0) {
              lVar39 = 0;
              uVar37 = 0;
              do {
                iVar13 = unres_schema_dup(local_40,(unres_schema *)list_orig,
                                          (void *)((long)node->iffeature[uVar35].features + lVar39),
                                          UNRES_IFFEAT,
                                          (void *)((long)plVar15->iffeature[uVar35].features +
                                                  lVar39));
                if (iVar13 == 1) {
                  *(undefined8 *)((long)plVar15->iffeature[uVar35].features + lVar39) =
                       *(undefined8 *)((long)node->iffeature[uVar35].features + lVar39);
                }
                else {
                  plVar34 = local_38;
                  if (iVar13 == -1) goto LAB_00159260;
                }
                uVar37 = uVar37 + 1;
                lVar39 = lVar39 + 8;
              } while (uVar37 < local_7c);
            }
          }
          module = local_40;
          unres = (unres_schema *)list_orig;
          plVar18 = node->iffeature;
          plVar7 = local_38->iffeature;
          plVar7[uVar35].ext_size = plVar18[uVar35].ext_size;
          iVar13 = lys_ext_dup(local_40,plVar18[uVar35].ext,plVar18[uVar35].ext_size,plVar7 + uVar35
                               ,LYEXT_PAR_IFFEATURE,&plVar7[uVar35].ext,(unres_schema *)list_orig);
          plVar34 = local_38;
          if (iVar13 != 0) goto LAB_00159260;
          uVar35 = uVar35 + 1;
          plVar32 = _size1;
          plVar33 = _size1;
        } while (uVar35 < node->iffeature_size);
      }
      do {
        plVar34 = local_38;
        iVar13 = local_9c;
        uVar30 = 1;
        plVar15 = plVar32;
        while( true ) {
          if (plVar15 == (lys_node *)0x0) goto LAB_00159601;
          if (plVar15->nodetype != LYS_USES) break;
          plVar15 = plVar15->parent;
        }
        if (plVar15->nodetype != LYS_AUGMENT) break;
        plVar32 = plVar15->parent;
        if (plVar32 == (lys_node *)0x0) {
          plVar32 = (lys_node *)0x0;
        }
        else if (plVar32->nodetype == LYS_AUGMENT) {
          plVar32 = plVar32->prev;
        }
      } while (plVar32 != (lys_node *)0x0);
      uVar30 = plVar15->flags & 3;
LAB_00159601:
      if (local_9c == 2) {
        uVar30 = local_38->flags & 0xfff8;
LAB_0015978b:
        local_38->flags = uVar30;
      }
      else if (local_9c == 1) {
        uVar3 = local_38->flags;
        if ((uVar3 & 4) == 0) {
          if (local_38->nodetype != LYS_USES) {
            uVar30 = uVar3 & 0xfff8 | uVar30;
            goto LAB_0015978b;
          }
        }
        else if (((uVar30 & 2) != 0) && ((uVar3 & 1) != 0)) {
          ly_vlog(LYE_INARG,LY_VLOG_LYS,local_38,"true","config");
          ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                  "State nodes cannot have configuration nodes as children.");
          goto LAB_00159260;
        }
      }
      iVar14 = lys_node_addchild(plVar33,local_38->module,local_38);
      plVar34 = local_38;
      if (iVar14 != 0) goto LAB_00159260;
      plVar32 = local_90;
      plVar33 = local_50;
      new_item_00 = local_88;
      if ((node->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        for (plVar15 = node->child; plVar15 != (lys_node *)0x0; plVar15 = plVar15->next) {
          if (((plVar15->nodetype & LYS_GROUPING) == LYS_UNKNOWN) &&
             (plVar26 = lys_node_dup_recursion(module,local_38,plVar15,unres,0,iVar13),
             plVar32 = local_90, plVar33 = local_50, plVar34 = local_38, new_item_00 = local_88,
             plVar26 == (lys_node *)0x0)) goto LAB_00159260;
        }
      }
      plVar34 = local_38;
      plVar15 = local_38;
      plVar38 = local_48;
      if ((((iVar13 == 1) && (local_38->nodetype == LYS_LIST)) && ((local_38->flags & 1) != 0)) &&
         (node->padding[2] == '\0')) {
        ly_vlog(LYE_MISSCHILDSTMT,LY_VLOG_LYS,local_38,"key","list");
        goto LAB_00159260;
      }
    }
    else {
      memcpy(plVar15->iffeature,node->iffeature,(ulong)plVar15->iffeature_size << 5);
      plVar32 = local_90;
      plVar33 = local_50;
      new_item_00 = local_88;
    }
    plVar26 = local_68;
    LVar4 = node->nodetype;
    if ((int)LVar4 < 0x80) {
      plVar34 = plVar15;
      if ((int)LVar4 < 0x10) {
        switch(LVar4) {
        case LYS_CONTAINER:
          if ((lys_when *)node[1].name != (lys_when *)0x0) {
            plVar21 = lys_when_dup(module,(lys_when *)node[1].name,unres);
            plVar23[1].name = (char *)plVar21;
          }
          pcVar17 = lydict_insert(plVar38,*(char **)&node[1].flags,0);
          *(char **)&plVar23[1].flags = pcVar17;
          bVar2 = node->padding[2];
          plVar23->padding[2] = bVar2;
          plVar22 = lys_restr_dup(module,(lys_restr *)node[1].dsc,(uint)bVar2,unres);
          plVar23[1].dsc = (char *)plVar22;
          return plVar15;
        case LYS_CHOICE:
          if ((lys_when *)node[1].name != (lys_when *)0x0) {
            plVar21 = lys_when_dup(module,(lys_when *)node[1].name,unres);
            local_88[1].name = (char *)plVar21;
            new_item_00 = local_88;
          }
          pcVar17 = node[1].dsc;
          if (iStack_78 != 0) {
            new_item_00[1].dsc = pcVar17;
            return plVar15;
          }
          if (pcVar17 == (char *)0x0) {
            unres_schema_dup(module,unres,node,UNRES_CHOICE_DFLT,new_item_00);
            return plVar15;
          }
          plVar25 = plVar15->module;
          if ((plVar25->field_0x40 & 1) != 0) {
            plVar25 = (lys_module *)plVar25->data;
          }
          iVar13 = lys_get_sibling(new_item_00->child,plVar25->name,0,*(char **)pcVar17,0,0x807d,
                                   (lys_node **)&new_item_00[1].dsc);
          if (iVar13 == 0) {
            return plVar15;
          }
          pLVar20 = ly_errno_location();
          *pLVar20 = LY_EINT;
          uVar31 = 0xb9b;
          goto LAB_00159669;
        default:
          goto switchD_00159336_caseD_3;
        case LYS_LEAF:
          list_orig = (lys_node_list *)&node[1].ref;
          local_48 = plVar38;
          iVar13 = ingrouping(plVar15);
          iVar13 = lys_type_dup(module,plVar15,(lys_type *)&plVar33[1].ref,(lys_type *)list_orig,
                                iVar13,unres);
          plVar34 = local_38;
          if (iVar13 == 0) {
            plVar16 = (lys_node *)lydict_insert(local_40->ctx,(char *)node[1].next,0);
            local_50[1].next = plVar16;
            if (node[1].prev != (lys_node *)0x0) {
              plVar16 = (lys_node *)lydict_insert(local_48,(char *)node[1].prev,0);
              local_50[1].prev = plVar16;
              iVar13 = ingrouping(local_38);
              if ((iVar13 == 0) ||
                 (iVar5._0_2_ = local_50[1].flags, iVar5._2_1_ = local_50[1].ext_size,
                 iVar5._3_1_ = local_50[1].iffeature_size, iVar5 != 9)) {
                iVar6._0_2_ = local_50[1].flags;
                iVar6._2_1_ = local_50[1].ext_size;
                iVar6._3_1_ = local_50[1].iffeature_size;
                plVar25 = local_40;
                if (iVar6 == 7) {
                  plVar25 = node->module;
                }
                iVar13 = unres_schema_add_node
                                   (plVar25,unres,&plVar33[1].ref,UNRES_TYPE_DFLT,
                                    (lys_node *)&local_50[1].prev);
                plVar34 = local_38;
                if (iVar13 == -1) break;
              }
            }
            plVar25 = local_40;
            bVar2 = node->padding[3];
            local_50->padding[3] = bVar2;
            plVar22 = lys_restr_dup(local_40,(lys_restr *)node[1].dsc,(uint)bVar2,unres);
            plVar16 = local_50;
            local_50[1].dsc = (char *)plVar22;
            if ((lys_when *)node[1].name == (lys_when *)0x0) {
              return local_38;
            }
            plVar21 = lys_when_dup(plVar25,(lys_when *)node[1].name,unres);
            plVar16[1].name = (char *)plVar21;
            return local_38;
          }
          break;
        case LYS_LEAFLIST:
          plVar16 = local_70 + 1;
          local_38 = (lys_node *)&node[1].ref;
          local_48 = plVar38;
          iVar13 = ingrouping(plVar15);
          iVar13 = lys_type_dup(module,plVar15,(lys_type *)&plVar16->ref,(lys_type *)local_38,iVar13
                                ,unres);
          plVar25 = local_40;
          if (iVar13 == 0) {
            local_38 = (lys_node *)&plVar16->ref;
            plVar23 = (lys_node *)lydict_insert(local_40->ctx,(char *)node[1].next,0);
            plVar16 = local_70;
            local_70[1].next = plVar23;
            *(undefined4 *)&local_70[1].priv = *(undefined4 *)&node[1].priv;
            *(undefined4 *)((long)&local_70[1].priv + 4) = *(undefined4 *)((long)&node[1].priv + 4);
            bVar2 = node->padding[3];
            local_70->padding[3] = bVar2;
            plVar22 = lys_restr_dup(plVar25,(lys_restr *)node[1].dsc,(uint)bVar2,unres);
            plVar16[1].dsc = (char *)plVar22;
            bVar2 = node->padding[2];
            plVar16->padding[2] = bVar2;
            plVar23 = (lys_node *)malloc((ulong)((uint)bVar2 * 8));
            plVar16[1].prev = plVar23;
            if (bVar2 != 0) {
              lVar39 = 0;
              uVar35 = 0;
              do {
                pcVar17 = lydict_insert(local_48,*(char **)((node[1].prev)->padding + lVar39 + -0x1c
                                                           ),0);
                *(char **)((local_70[1].prev)->padding + lVar39 + -0x1c) = pcVar17;
                iVar13 = ingrouping(plVar15);
                if ((iVar13 == 0) ||
                   (iVar13._0_2_ = local_70[1].flags, iVar13._2_1_ = local_70[1].ext_size,
                   iVar13._3_1_ = local_70[1].iffeature_size, iVar13 != 9)) {
                  iVar14._0_2_ = local_70[1].flags;
                  iVar14._2_1_ = local_70[1].ext_size;
                  iVar14._3_1_ = local_70[1].iffeature_size;
                  if ((iVar14 != 7) ||
                     ((pcVar17 = strchr(*(char **)((local_70[1].prev)->padding + lVar39 + -0x1c),
                                        0x3a), pcVar17 != (char *)0x0 ||
                      (plVar25 = node->module, plVar25 == local_40)))) {
                    plVar25 = local_40;
                  }
                  iVar13 = unres_schema_add_node
                                     (plVar25,(unres_schema *)list_orig,local_38,UNRES_TYPE_DFLT,
                                      (lys_node *)((local_70[1].prev)->padding + lVar39 + -0x1c));
                  if (iVar13 == -1) goto LAB_00159260;
                }
                uVar35 = uVar35 + 1;
                lVar39 = lVar39 + 8;
                plVar16 = local_70;
              } while (uVar35 < local_70->padding[2]);
            }
            if ((lys_when *)node[1].name == (lys_when *)0x0) {
              return plVar15;
            }
            plVar21 = lys_when_dup(local_40,(lys_when *)node[1].name,(unres_schema *)list_orig);
            plVar16[1].name = (char *)plVar21;
            return plVar15;
          }
        }
        goto LAB_00159260;
      }
      if (LVar4 == LYS_LIST) {
        *(undefined4 *)&local_68[1].iffeature = *(undefined4 *)&local_60[1].iffeature;
        *(undefined4 *)((long)&local_68[1].iffeature + 4) =
             *(undefined4 *)((long)&local_60[1].iffeature + 4);
        bVar2 = local_60->padding[0];
        local_68->padding[0] = bVar2;
        local_48 = plVar38;
        plVar22 = lys_restr_dup(module,(lys_restr *)local_60[1].dsc,(uint)bVar2,unres);
        plVar16 = local_60;
        plVar26[1].dsc = (char *)plVar22;
        bVar2 = local_60->padding[2];
        plVar26->padding[2] = bVar2;
        if ((ulong)bVar2 != 0) {
          pvVar24 = calloc((ulong)bVar2,8);
          plVar23 = local_68;
          *(void **)&local_68[1].flags = pvVar24;
          plVar25 = (lys_module *)lydict_insert(local_48,(char *)plVar16[1].module,0);
          plVar23[1].module = plVar25;
          pvVar24 = *(void **)&plVar23[1].flags;
          if (pvVar24 == (void *)0x0) goto LAB_00159eaf;
          plVar16 = _size1;
          if (iStack_78 == 0) {
            for (; plVar16 != (lys_node *)0x0; plVar16 = plVar16->parent) {
              if (plVar16->nodetype == LYS_GROUPING) goto LAB_00159d53;
            }
            iVar13 = unres_schema_add_node(module,unres,local_68,UNRES_LIST_KEYS,(lys_node *)0x0);
            if (iVar13 == -1) goto LAB_00159260;
          }
          else {
            memcpy(pvVar24,*(void **)&local_60[1].flags,(ulong)local_68->padding[2] << 3);
          }
        }
LAB_00159d53:
        plVar16 = local_68;
        bVar2 = local_60->padding[3];
        local_68->padding[3] = bVar2;
        pplVar27 = (lys_ext_instance **)malloc((ulong)bVar2 << 4);
        plVar25 = local_40;
        plVar16[1].ext = pplVar27;
        if (pplVar27 != (lys_ext_instance **)0x0) {
          if (plVar16->padding[3] != '\0') {
            uVar35 = 0;
            do {
              bVar2 = *(byte *)(local_60[1].ext + uVar35 * 2 + 1);
              pplVar27 = plVar16[1].ext;
              *(byte *)(pplVar27 + uVar35 * 2 + 1) = bVar2;
              plVar28 = (lys_ext_instance *)malloc((ulong)bVar2 << 3);
              plVar38 = local_48;
              pplVar27[uVar35 * 2] = plVar28;
              if (plVar28 == (lys_ext_instance *)0x0) {
                pLVar20 = ly_errno_location();
                *pLVar20 = LY_EMEM;
                ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_node_dup_recursion");
                plVar34 = local_38;
                goto LAB_00159260;
              }
              _iStack_78 = uVar35;
              if (*(char *)(plVar16[1].ext + uVar35 * 2 + 1) != '\0') {
                uVar37 = 0;
                do {
                  plVar29 = (lys_ext *)
                            lydict_insert(plVar38,(char *)(&local_60[1].ext[uVar35 * 2]->def)
                                                          [uVar37],0);
                  (&plVar16[1].ext[uVar35 * 2]->def)[uVar37] = plVar29;
                  new_item = (undefined8 *)malloc(0x18);
                  *new_item = plVar16;
                  pplVar27 = plVar16[1].ext;
                  new_item[1] = (&pplVar27[uVar35 * 2]->def)[uVar37];
                  new_item[2] = (long)(pplVar27 + uVar35 * 2) + 9;
                  unres_schema_dup(plVar25,(unres_schema *)list_orig,&local_60,UNRES_LIST_UNIQ,
                                   new_item);
                  uVar37 = uVar37 + 1;
                } while (uVar37 < *(byte *)(plVar16[1].ext + uVar35 * 2 + 1));
              }
              uVar35 = _iStack_78 + 1;
            } while (uVar35 < plVar16->padding[3]);
          }
          plVar15 = local_38;
          if ((lys_when *)local_60[1].name == (lys_when *)0x0) {
            return local_38;
          }
          plVar21 = lys_when_dup(local_40,(lys_when *)local_60[1].name,(unres_schema *)list_orig);
LAB_00159ea6:
          local_68[1].name = (char *)plVar21;
          return plVar15;
        }
        goto LAB_00159eaf;
      }
      if (LVar4 == LYS_ANYXML) {
LAB_00159734:
        bVar2 = node->padding[3];
        plVar16->padding[3] = bVar2;
        plVar22 = lys_restr_dup(module,(lys_restr *)node[1].dsc,(uint)bVar2,unres);
        plVar16[1].dsc = (char *)plVar22;
        plVar21 = (lys_when *)node[1].name;
joined_r0x001596b2:
        if (plVar21 == (lys_when *)0x0) {
          return plVar15;
        }
        plVar21 = lys_when_dup(module,plVar21,unres);
        plVar16[1].name = (char *)plVar21;
        return plVar15;
      }
      if (LVar4 == LYS_CASE) {
        if ((lys_when *)node[1].name == (lys_when *)0x0) {
          return plVar15;
        }
        plVar21 = lys_when_dup(module,(lys_when *)node[1].name,unres);
        local_68 = plVar36;
        goto LAB_00159ea6;
      }
    }
    else if ((int)LVar4 < 0x400) {
      if (LVar4 == LYS_NOTIF) {
        return plVar15;
      }
      if (LVar4 == LYS_RPC) {
        return plVar15;
      }
      if (LVar4 == LYS_INPUT) {
        return plVar15;
      }
    }
    else if ((int)LVar4 < 0x4000) {
      if (LVar4 == LYS_OUTPUT) {
        return plVar15;
      }
      if (LVar4 == LYS_USES) {
        uVar1 = node[1].ext_size;
        uVar8 = node[1].iffeature_size;
        uVar9 = node[1].padding[0];
        uVar10 = node[1].padding[1];
        uVar11 = node[1].padding[2];
        uVar12 = node[1].padding[3];
        plVar32[1].flags = node[1].flags;
        plVar32[1].ext_size = uVar1;
        plVar32[1].iffeature_size = uVar8;
        plVar32[1].padding[0] = uVar9;
        plVar32[1].padding[1] = uVar10;
        plVar32[1].padding[2] = uVar11;
        plVar32[1].padding[3] = uVar12;
        plVar21 = (lys_when *)node[1].name;
        plVar16 = plVar32;
        goto joined_r0x001596b2;
      }
    }
    else {
      if (LVar4 == LYS_ACTION) {
        return plVar15;
      }
      if (LVar4 == LYS_ANYDATA) goto LAB_00159734;
    }
switchD_00159336_caseD_3:
    pLVar20 = ly_errno_location();
    *pLVar20 = LY_EINT;
    uVar31 = 0xc4b;
  }
  else {
    if ((int)LVar4 < 0x400) {
      if (LVar4 != LYS_NOTIF) {
        if (LVar4 == LYS_RPC) goto LAB_00159190;
        if (LVar4 != LYS_INPUT) goto switchD_00159077_caseD_3;
      }
LAB_0015914e:
      __size = 0x78;
LAB_0015919a:
      plVar15 = (lys_node *)calloc(1,__size);
      local_50 = (lys_node *)0x0;
      local_70 = (lys_node *)0x0;
      local_68 = (lys_node *)0x0;
      plVar16 = (lys_node *)0x0;
      local_90 = (lys_node *)0x0;
      plVar23 = (lys_node *)0x0;
      local_88 = (lys_node *)0x0;
      goto LAB_001591b2;
    }
    if ((int)LVar4 < 0x4000) {
      if (LVar4 == LYS_OUTPUT) goto LAB_0015914e;
      if (LVar4 == LYS_USES) {
        local_90 = (lys_node *)calloc(1,0x88);
        local_50 = (lys_node *)0x0;
        local_70 = (lys_node *)0x0;
        local_68 = (lys_node *)0x0;
        plVar16 = (lys_node *)0x0;
        plVar15 = local_90;
        plVar23 = (lys_node *)0x0;
        local_88 = (lys_node *)0x0;
        goto LAB_001591b2;
      }
    }
    else {
      if (LVar4 == LYS_ACTION) {
LAB_00159190:
        __size = 0x70;
        goto LAB_0015919a;
      }
      if (LVar4 == LYS_ANYDATA) goto LAB_0015916c;
    }
switchD_00159077_caseD_3:
    pLVar20 = ly_errno_location();
    *pLVar20 = LY_EINT;
    plVar15 = (lys_node *)0x0;
    uVar31 = 0xaf1;
  }
LAB_00159669:
  ly_log(LY_LLERR,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
         ,uVar31);
  plVar34 = plVar15;
LAB_00159260:
  lys_node_free(plVar34,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
  return (lys_node *)0x0;
}

Assistant:

static struct lys_node *
lys_node_dup_recursion(struct lys_module *module, struct lys_node *parent, const struct lys_node *node,
                       struct unres_schema *unres, int shallow, int finalize)
{
    struct lys_node *retval = NULL, *iter, *p;
    struct lys_module *tmp_mod;
    struct ly_ctx *ctx = module->ctx;
    int i, j, rc;
    unsigned int size, size1, size2;
    struct unres_list_uniq *unique_info;
    uint16_t flags;

    struct lys_node_container *cont = NULL;
    struct lys_node_container *cont_orig = (struct lys_node_container *)node;
    struct lys_node_choice *choice = NULL;
    struct lys_node_choice *choice_orig = (struct lys_node_choice *)node;
    struct lys_node_leaf *leaf = NULL;
    struct lys_node_leaf *leaf_orig = (struct lys_node_leaf *)node;
    struct lys_node_leaflist *llist = NULL;
    struct lys_node_leaflist *llist_orig = (struct lys_node_leaflist *)node;
    struct lys_node_list *list = NULL;
    struct lys_node_list *list_orig = (struct lys_node_list *)node;
    struct lys_node_anydata *any = NULL;
    struct lys_node_anydata *any_orig = (struct lys_node_anydata *)node;
    struct lys_node_uses *uses = NULL;
    struct lys_node_uses *uses_orig = (struct lys_node_uses *)node;
    struct lys_node_rpc_action *rpc = NULL;
    struct lys_node_inout *io = NULL;
    struct lys_node_notif *ntf = NULL;
    struct lys_node_case *cs = NULL;
    struct lys_node_case *cs_orig = (struct lys_node_case *)node;

    /* we cannot just duplicate memory since the strings are stored in
     * dictionary and we need to update dictionary counters.
     */

    switch (node->nodetype) {
    case LYS_CONTAINER:
        cont = calloc(1, sizeof *cont);
        retval = (struct lys_node *)cont;
        break;

    case LYS_CHOICE:
        choice = calloc(1, sizeof *choice);
        retval = (struct lys_node *)choice;
        break;

    case LYS_LEAF:
        leaf = calloc(1, sizeof *leaf);
        retval = (struct lys_node *)leaf;
        break;

    case LYS_LEAFLIST:
        llist = calloc(1, sizeof *llist);
        retval = (struct lys_node *)llist;
        break;

    case LYS_LIST:
        list = calloc(1, sizeof *list);
        retval = (struct lys_node *)list;
        break;

    case LYS_ANYXML:
    case LYS_ANYDATA:
        any = calloc(1, sizeof *any);
        retval = (struct lys_node *)any;
        break;

    case LYS_USES:
        uses = calloc(1, sizeof *uses);
        retval = (struct lys_node *)uses;
        break;

    case LYS_CASE:
        cs = calloc(1, sizeof *cs);
        retval = (struct lys_node *)cs;
        break;

    case LYS_RPC:
    case LYS_ACTION:
        rpc = calloc(1, sizeof *rpc);
        retval = (struct lys_node *)rpc;
        break;

    case LYS_INPUT:
    case LYS_OUTPUT:
        io = calloc(1, sizeof *io);
        retval = (struct lys_node *)io;
        break;

    case LYS_NOTIF:
        ntf = calloc(1, sizeof *ntf);
        retval = (struct lys_node *)ntf;
        break;

    default:
        LOGINT;
        goto error;
    }

    if (!retval) {
        LOGMEM;
        return NULL;
    }

    /*
     * duplicate generic part of the structure
     */
    retval->name = lydict_insert(ctx, node->name, 0);
    retval->dsc = lydict_insert(ctx, node->dsc, 0);
    retval->ref = lydict_insert(ctx, node->ref, 0);
    retval->flags = node->flags;

    retval->module = module;
    retval->nodetype = node->nodetype;

    retval->prev = retval;

    retval->ext_size = node->ext_size;
    if (lys_ext_dup(module, node->ext, node->ext_size, retval, LYEXT_PAR_NODE, &retval->ext, unres)) {
        goto error;
    }

    if (node->iffeature_size) {
        retval->iffeature_size = node->iffeature_size;
        retval->iffeature = calloc(retval->iffeature_size, sizeof *retval->iffeature);
        if (!retval->iffeature) {
            LOGMEM;
            goto error;
        }
    }

    if (!shallow) {
        for (i = 0; i < node->iffeature_size; ++i) {
            resolve_iffeature_getsizes(&node->iffeature[i], &size1, &size2);
            if (size1) {
                /* there is something to duplicate */

                /* duplicate compiled expression */
                size = (size1 / 4) + (size1 % 4) ? 1 : 0;
                retval->iffeature[i].expr = malloc(size * sizeof *retval->iffeature[i].expr);
                memcpy(retval->iffeature[i].expr, node->iffeature[i].expr, size * sizeof *retval->iffeature[i].expr);

                /* list of feature pointer must be updated to point to the resulting tree */
                retval->iffeature[i].features = calloc(size2, sizeof *retval->iffeature[i].features);
                for (j = 0; (unsigned int)j < size2; j++) {
                    rc = unres_schema_dup(module, unres, &node->iffeature[i].features[j], UNRES_IFFEAT,
                                          &retval->iffeature[i].features[j]);
                    if (rc == EXIT_FAILURE) {
                        /* feature is resolved in origin, so copy it
                         * - duplication is used for instantiating groupings
                         * and if-feature inside grouping is supposed to be
                         * resolved inside the original grouping, so we want
                         * to keep pointers to features from the grouping
                         * context */
                        retval->iffeature[i].features[j] = node->iffeature[i].features[j];
                    } else if (rc == -1) {
                        goto error;
                    } /* else unres was duplicated */
                }
            }

            /* duplicate if-feature's extensions */
            retval->iffeature[i].ext_size = node->iffeature[i].ext_size;
            if (lys_ext_dup(module, node->iffeature[i].ext, node->iffeature[i].ext_size,
                            &retval->iffeature[i], LYEXT_PAR_IFFEATURE, &retval->iffeature[i].ext, unres)) {
                goto error;
            }
        }

        /* inherit config flags */
        p = parent;
        do {
            for (iter = p; iter && (iter->nodetype == LYS_USES); iter = iter->parent);
        } while (iter && iter->nodetype == LYS_AUGMENT && (p = lys_parent(iter)));
        if (iter) {
            flags = iter->flags & LYS_CONFIG_MASK;
        } else {
            /* default */
            flags = LYS_CONFIG_W;
        }

        switch (finalize) {
        case 1:
            /* inherit config flags */
            if (retval->flags & LYS_CONFIG_SET) {
                /* skip nodes with an explicit config value */
                if ((flags & LYS_CONFIG_R) && (retval->flags & LYS_CONFIG_W)) {
                    LOGVAL(LYE_INARG, LY_VLOG_LYS, retval, "true", "config");
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
                    goto error;
                }
                break;
            }

            if (retval->nodetype != LYS_USES) {
                retval->flags = (retval->flags & ~LYS_CONFIG_MASK) | flags;
            }
            break;
        case 2:
            /* erase config flags */
            retval->flags &= ~LYS_CONFIG_MASK;
            retval->flags &= ~LYS_CONFIG_SET;
            break;
        }

        /* connect it to the parent */
        if (lys_node_addchild(parent, retval->module, retval)) {
            goto error;
        }

        /* go recursively */
        if (!(node->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LY_TREE_FOR(node->child, iter) {
                if (iter->nodetype & LYS_GROUPING) {
                    /* do not instantiate groupings */
                    continue;
                }
                if (!lys_node_dup_recursion(module, retval, iter, unres, 0, finalize)) {
                    goto error;
                }
            }
        }

        if (finalize == 1) {
            /* check that configuration lists have keys
             * - we really want to check keys_size in original node, because the keys are
             * not yet resolved here, it is done below in nodetype specific part */
            if ((retval->nodetype == LYS_LIST) && (retval->flags & LYS_CONFIG_W)
                    && !((struct lys_node_list *)node)->keys_size) {
                LOGVAL(LYE_MISSCHILDSTMT, LY_VLOG_LYS, retval, "key", "list");
                goto error;
            }
        }
    } else {
        memcpy(retval->iffeature, node->iffeature, retval->iffeature_size * sizeof *retval->iffeature);
    }

    /*
     * duplicate specific part of the structure
     */
    switch (node->nodetype) {
    case LYS_CONTAINER:
        if (cont_orig->when) {
            cont->when = lys_when_dup(module, cont_orig->when, unres);
        }
        cont->presence = lydict_insert(ctx, cont_orig->presence, 0);

        cont->must_size = cont_orig->must_size;
        cont->must = lys_restr_dup(module, cont_orig->must, cont->must_size, unres);

        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */

        break;
    case LYS_CHOICE:
        if (choice_orig->when) {
            choice->when = lys_when_dup(module, choice_orig->when, unres);
        }

        if (!shallow) {
            if (choice_orig->dflt) {
                rc = lys_get_sibling(choice->child, lys_node_module(retval)->name, 0, choice_orig->dflt->name, 0,
                                            LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST,
                                            (const struct lys_node **)&choice->dflt);
                if (rc) {
                    if (rc == EXIT_FAILURE) {
                        LOGINT;
                    }
                    goto error;
                }
            } else {
                /* useless to check return value, we don't know whether
                * there really wasn't any default defined or it just hasn't
                * been resolved, we just hope for the best :)
                */
                unres_schema_dup(module, unres, choice_orig, UNRES_CHOICE_DFLT, choice);
            }
        } else {
            choice->dflt = choice_orig->dflt;
        }
        break;

    case LYS_LEAF:
        if (lys_type_dup(module, retval, &(leaf->type), &(leaf_orig->type), ingrouping(retval), unres)) {
            goto error;
        }
        leaf->units = lydict_insert(module->ctx, leaf_orig->units, 0);

        if (leaf_orig->dflt) {
            leaf->dflt = lydict_insert(ctx, leaf_orig->dflt, 0);
            if (!ingrouping(retval) || (leaf->type.base != LY_TYPE_LEAFREF)) {
                /* problem is when it is an identityref referencing an identity from a module
                 * and we are using the grouping in a different module */
                if (leaf->type.base == LY_TYPE_IDENT) {
                    tmp_mod = leaf_orig->module;
                } else {
                    tmp_mod = module;
                }
                if (unres_schema_add_node(tmp_mod, unres, &leaf->type, UNRES_TYPE_DFLT,
                                          (struct lys_node *)(&leaf->dflt)) == -1) {
                    goto error;
                }
            }
        }

        leaf->must_size = leaf_orig->must_size;
        leaf->must = lys_restr_dup(module, leaf_orig->must, leaf->must_size, unres);

        if (leaf_orig->when) {
            leaf->when = lys_when_dup(module, leaf_orig->when, unres);
        }
        break;

    case LYS_LEAFLIST:
        if (lys_type_dup(module, retval, &(llist->type), &(llist_orig->type), ingrouping(retval), unres)) {
            goto error;
        }
        llist->units = lydict_insert(module->ctx, llist_orig->units, 0);

        llist->min = llist_orig->min;
        llist->max = llist_orig->max;

        llist->must_size = llist_orig->must_size;
        llist->must = lys_restr_dup(module, llist_orig->must, llist->must_size, unres);

        llist->dflt_size = llist_orig->dflt_size;
        llist->dflt = malloc(llist->dflt_size * sizeof *llist->dflt);
        for (i = 0; i < llist->dflt_size; i++) {
            llist->dflt[i] = lydict_insert(ctx, llist_orig->dflt[i], 0);
            if (!ingrouping(retval) || (llist->type.base != LY_TYPE_LEAFREF)) {
                if ((llist->type.base == LY_TYPE_IDENT) && !strchr(llist->dflt[i], ':') && (module != llist_orig->module)) {
                    tmp_mod = llist_orig->module;
                } else {
                    tmp_mod = module;
                }
                if (unres_schema_add_node(tmp_mod, unres, &llist->type, UNRES_TYPE_DFLT,
                                          (struct lys_node *)(&llist->dflt[i])) == -1) {
                    goto error;
                }
            }
        }

        if (llist_orig->when) {
            llist->when = lys_when_dup(module, llist_orig->when, unres);
        }
        break;

    case LYS_LIST:
        list->min = list_orig->min;
        list->max = list_orig->max;

        list->must_size = list_orig->must_size;
        list->must = lys_restr_dup(module, list_orig->must, list->must_size, unres);

        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */

        list->keys_size = list_orig->keys_size;
        if (list->keys_size) {
            list->keys = calloc(list->keys_size, sizeof *list->keys);
            list->keys_str = lydict_insert(ctx, list_orig->keys_str, 0);
            if (!list->keys) {
                LOGMEM;
                goto error;
            }

            if (!shallow) {
                /* the keys are going to be resolved only if the list is instantiated in data tree, not just
                 * in another grouping */
                for (iter = parent; iter && iter->nodetype != LYS_GROUPING; iter = iter->parent);
                if (!iter && unres_schema_add_node(module, unres, list, UNRES_LIST_KEYS, NULL) == -1) {
                    goto error;
                }
            } else {
                memcpy(list->keys, list_orig->keys, list->keys_size * sizeof *list->keys);
            }
        }

        list->unique_size = list_orig->unique_size;
        list->unique = malloc(list->unique_size * sizeof *list->unique);
        if (!list->unique) {
            LOGMEM;
            goto error;
        }
        for (i = 0; i < list->unique_size; ++i) {
            list->unique[i].expr_size = list_orig->unique[i].expr_size;
            list->unique[i].expr = malloc(list->unique[i].expr_size * sizeof *list->unique[i].expr);
            if (!list->unique[i].expr) {
                LOGMEM;
                goto error;
            }
            for (j = 0; j < list->unique[i].expr_size; j++) {
                list->unique[i].expr[j] = lydict_insert(ctx, list_orig->unique[i].expr[j], 0);

                /* if it stays in unres list, duplicate it also there */
                unique_info = malloc(sizeof *unique_info);
                unique_info->list = (struct lys_node *)list;
                unique_info->expr = list->unique[i].expr[j];
                unique_info->trg_type = &list->unique[i].trg_type;
                unres_schema_dup(module, unres, &list_orig, UNRES_LIST_UNIQ, unique_info);
            }
        }

        if (list_orig->when) {
            list->when = lys_when_dup(module, list_orig->when, unres);
        }
        break;

    case LYS_ANYXML:
    case LYS_ANYDATA:
        any->must_size = any_orig->must_size;
        any->must = lys_restr_dup(module, any_orig->must, any->must_size, unres);

        if (any_orig->when) {
            any->when = lys_when_dup(module, any_orig->when, unres);
        }
        break;

    case LYS_USES:
        uses->grp = uses_orig->grp;

        if (uses_orig->when) {
            uses->when = lys_when_dup(module, uses_orig->when, unres);
        }
        /* it is not needed to duplicate refine, nor augment. They are already applied to the uses children */
        break;

    case LYS_CASE:
        if (cs_orig->when) {
            cs->when = lys_when_dup(module, cs_orig->when, unres);
        }
        break;

    case LYS_ACTION:
    case LYS_RPC:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */
        break;

    default:
        /* LY_NODE_AUGMENT */
        LOGINT;
        goto error;
    }

    return retval;

error:

    lys_node_free(retval, NULL, 0);
    return NULL;
}